

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMLSParserImpl::parseWithContext
          (DOMLSParserImpl *this,DOMLSInput *source,DOMNode *contextNode,ActionType action)

{
  DOMLSResourceResolver *entityResolver;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  DOMException *this_00;
  undefined4 extraout_var;
  DOMDocumentFragment *pDVar5;
  undefined4 extraout_var_00;
  MemoryManager *manager;
  XMLSize_t XVar6;
  DOMLSException *this_01;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  long *plVar7;
  DOMNode *parent;
  DOMNode *node;
  DOMNode *result;
  Wrapper4DOMLSInput isWrapper;
  bool oldElementContentWhitespace;
  ValSchemes oldValidate;
  DOMDocumentFragment *holder;
  ActionType action_local;
  DOMNode *contextNode_local;
  DOMLSInput *source_local;
  DOMLSParserImpl *this_local;
  
  bVar1 = AbstractDOMParser::getParseInProgress(&this->super_AbstractDOMParser);
  if (bVar1) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_00,0xb,0x21,(this->super_AbstractDOMParser).fMemoryManager);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if (this->fFilter == (DOMLSParserFilter *)&g_AbortFilter) {
    this->fFilter = (DOMLSParserFilter *)0x0;
  }
  if (this->fFilterAction !=
      (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *)0x0)
  {
    ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::
    removeAll(this->fFilterAction);
  }
  if (this->fFilterDelayedTextNodes != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0) {
    ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeAll(this->fFilterDelayedTextNodes);
  }
  iVar2 = (*contextNode->_vptr_DOMNode[0xc])();
  pDVar5 = (DOMDocumentFragment *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))();
  if (((action == ACTION_INSERT_BEFORE) || (action == ACTION_INSERT_AFTER)) ||
     (action == ACTION_REPLACE)) {
    iVar2 = (*contextNode->_vptr_DOMNode[5])();
    this->fWrapNodesContext = (DOMNode *)CONCAT44(extraout_var_00,iVar2);
  }
  else {
    this->fWrapNodesContext = contextNode;
  }
  this->fWrapNodesInDocumentFragment = pDVar5;
  this->fWrapNodesAction = action;
  isWrapper.fEntityResolver._4_4_ =
       AbstractDOMParser::getValidationScheme(&this->super_AbstractDOMParser);
  AbstractDOMParser::setValidationScheme(&this->super_AbstractDOMParser,Val_Never);
  isWrapper.fEntityResolver._3_1_ =
       AbstractDOMParser::getIncludeIgnorableWhitespace(&this->super_AbstractDOMParser);
  AbstractDOMParser::setIncludeIgnorableWhitespace(&this->super_AbstractDOMParser,true);
  entityResolver = this->fEntityResolver;
  manager = AbstractDOMParser::getMemoryManager(&this->super_AbstractDOMParser);
  Wrapper4DOMLSInput::Wrapper4DOMLSInput
            ((Wrapper4DOMLSInput *)&result,source,entityResolver,false,manager);
  AbstractDOMParser::parse(&this->super_AbstractDOMParser,(InputSource *)&result);
  AbstractDOMParser::setValidationScheme
            (&this->super_AbstractDOMParser,isWrapper.fEntityResolver._4_4_);
  AbstractDOMParser::setIncludeIgnorableWhitespace
            (&this->super_AbstractDOMParser,(bool)(isWrapper.fEntityResolver._3_1_ & 1));
  this->fWrapNodesContext = (DOMNode *)0x0;
  this->fWrapNodesInDocumentFragment = (DOMDocumentFragment *)0x0;
  (this->super_AbstractDOMParser).fDocument = (DOMDocumentImpl *)0x0;
  XVar6 = AbstractDOMParser::getErrorCount(&this->super_AbstractDOMParser);
  if (XVar6 == 0) {
    iVar2 = (*(pDVar5->super_DOMNode)._vptr_DOMNode[7])();
    iVar3 = (*contextNode->_vptr_DOMNode[5])();
    plVar7 = (long *)CONCAT44(extraout_var_02,iVar3);
    switch(action) {
    case ACTION_REPLACE_CHILDREN:
      while( true ) {
        iVar3 = (*contextNode->_vptr_DOMNode[7])();
        if (CONCAT44(extraout_var_03,iVar3) == 0) break;
        iVar3 = (*contextNode->_vptr_DOMNode[0x10])(contextNode,CONCAT44(extraout_var_03,iVar3));
        (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x138))();
      }
    case ACTION_APPEND_AS_CHILDREN:
      while( true ) {
        iVar3 = (*(pDVar5->super_DOMNode)._vptr_DOMNode[7])();
        if (CONCAT44(extraout_var_05,iVar3) == 0) break;
        iVar3 = (*(pDVar5->super_DOMNode)._vptr_DOMNode[0x10])
                          (pDVar5,CONCAT44(extraout_var_05,iVar3));
        (*contextNode->_vptr_DOMNode[0x11])(contextNode,CONCAT44(extraout_var_06,iVar3));
      }
      break;
    case ACTION_INSERT_BEFORE:
      while( true ) {
        iVar3 = (*(pDVar5->super_DOMNode)._vptr_DOMNode[7])();
        if (CONCAT44(extraout_var_07,iVar3) == 0) break;
        iVar3 = (*(pDVar5->super_DOMNode)._vptr_DOMNode[0x10])
                          (pDVar5,CONCAT44(extraout_var_07,iVar3));
        (**(code **)(*plVar7 + 0x70))(plVar7,iVar3,contextNode);
      }
      break;
    case ACTION_INSERT_AFTER:
      while( true ) {
        iVar3 = (*(pDVar5->super_DOMNode)._vptr_DOMNode[8])();
        if (CONCAT44(extraout_var_08,iVar3) == 0) break;
        iVar3 = (*(pDVar5->super_DOMNode)._vptr_DOMNode[0x10])
                          (pDVar5,CONCAT44(extraout_var_08,iVar3));
        iVar4 = (*contextNode->_vptr_DOMNode[10])();
        (**(code **)(*plVar7 + 0x70))(plVar7,iVar3,iVar4);
      }
      break;
    case ACTION_REPLACE:
      while( true ) {
        iVar3 = (*(pDVar5->super_DOMNode)._vptr_DOMNode[7])();
        if (CONCAT44(extraout_var_09,iVar3) == 0) break;
        iVar3 = (*(pDVar5->super_DOMNode)._vptr_DOMNode[0x10])
                          (pDVar5,CONCAT44(extraout_var_09,iVar3));
        (**(code **)(*plVar7 + 0x70))(plVar7,iVar3,contextNode);
      }
      plVar7 = (long *)(**(code **)(*plVar7 + 0x80))(plVar7,contextNode);
      (**(code **)(*plVar7 + 0x138))();
    }
    (*(pDVar5->super_DOMNode)._vptr_DOMNode[0x27])();
    Wrapper4DOMLSInput::~Wrapper4DOMLSInput((Wrapper4DOMLSInput *)&result);
    return (DOMNode *)CONCAT44(extraout_var_01,iVar2);
  }
  (*(pDVar5->super_DOMNode)._vptr_DOMNode[0x27])();
  this_01 = (DOMLSException *)__cxa_allocate_exception(0x28);
  DOMLSException::DOMLSException(this_01,0x51,0x23,(this->super_AbstractDOMParser).fMemoryManager);
  __cxa_throw(this_01,&DOMLSException::typeinfo,DOMLSException::~DOMLSException);
}

Assistant:

DOMNode* DOMLSParserImpl::parseWithContext(const DOMLSInput* source,
                                           DOMNode* contextNode,
                                           const ActionType action)
{
    if (getParseInProgress())
        throw DOMException(DOMException::INVALID_STATE_ERR, XMLDOMMsg::LSParser_ParseInProgress, fMemoryManager);

    // remove the abort filter, if present
    if(fFilter==&g_AbortFilter)
        fFilter=0;
    if(fFilterAction)
        fFilterAction->removeAll();
    if(fFilterDelayedTextNodes)
        fFilterDelayedTextNodes->removeAll();

    DOMDocumentFragment* holder = contextNode->getOwnerDocument()->createDocumentFragment();
    // When parsing the input stream, the context node (or its parent, depending on where
    // the result will be inserted) is used for resolving unbound namespace prefixes
    if(action==ACTION_INSERT_BEFORE || action==ACTION_INSERT_AFTER || action==ACTION_REPLACE)
        fWrapNodesContext = contextNode->getParentNode();
    else
        fWrapNodesContext = contextNode;
    fWrapNodesInDocumentFragment = holder;
    fWrapNodesAction = action;
    // When calling parseWithContext, the values of the following configuration parameters
    // will be ignored and their default values will always be used instead: "validate",
    // "validate-if-schema", and "element-content-whitespace".
    ValSchemes oldValidate = getValidationScheme();
    setValidationScheme(Val_Never);
    bool oldElementContentWhitespace = getIncludeIgnorableWhitespace();
    setIncludeIgnorableWhitespace(true);

    Wrapper4DOMLSInput isWrapper((DOMLSInput*)source, fEntityResolver, false, getMemoryManager());
    AbstractDOMParser::parse(isWrapper);

    setValidationScheme(oldValidate);
    setIncludeIgnorableWhitespace(oldElementContentWhitespace);
    fWrapNodesContext = NULL;
    fWrapNodesInDocumentFragment = NULL;
    fDocument = NULL;

    if(getErrorCount()!=0)
    {
        holder->release();
        throw DOMLSException(DOMLSException::PARSE_ERR, XMLDOMMsg::LSParser_ParsingFailed, fMemoryManager);
    }

    DOMNode* result = holder->getFirstChild();
    DOMNode* node, *parent = contextNode->getParentNode();
    switch(action)
    {
    case ACTION_REPLACE_CHILDREN:
        // remove existing children
        while((node = contextNode->getFirstChild())!=NULL)
            contextNode->removeChild(node)->release();
        // then fall back to behave like an append
    case ACTION_APPEND_AS_CHILDREN:
        while((node = holder->getFirstChild())!=NULL)
            contextNode->appendChild(holder->removeChild(node));
        break;
    case ACTION_INSERT_BEFORE:
        while((node = holder->getFirstChild())!=NULL)
            parent->insertBefore(holder->removeChild(node), contextNode);
        break;
    case ACTION_INSERT_AFTER:
        while((node = holder->getLastChild())!=NULL)
            parent->insertBefore(holder->removeChild(node), contextNode->getNextSibling());
        break;
    case ACTION_REPLACE:
        while((node = holder->getFirstChild())!=NULL)
            parent->insertBefore(holder->removeChild(node), contextNode);
        parent->removeChild(contextNode)->release();
        break;
    }
    holder->release();

    // TODO whenever we add support for DOM Mutation Events:
    //   As the new data is inserted into the document, at least one mutation event is fired
    //   per new immediate child or sibling of the context node.
    return result;
}